

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<char[64],unsigned_int,char[8],unsigned_int,char[13]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [64],uint *Args_1,
          char (*Args_2) [8],uint *Args_3,char (*Args_4) [13])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[64],unsigned_int,char[8],unsigned_int,char[13]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [64])this,(uint *)Args,(char (*) [8])Args_1,(uint *)Args_2,
             (char (*) [13])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}